

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PartialUnion.cpp
# Opt level: O0

void __thiscall
dgrminer::PartialUnion::appendToEncodingLabel(PartialUnion *this,int encoding,string *label)

{
  pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_48;
  string *local_20;
  string *label_local;
  PartialUnion *pPStack_10;
  int encoding_local;
  PartialUnion *this_local;
  
  local_20 = label;
  label_local._4_4_ = encoding;
  pPStack_10 = this;
  std::make_pair<int&,std::__cxx11::string&>(&local_48,(int *)((long)&label_local + 4),label);
  std::
  map<int,std::__cxx11::string,std::less<int>,std::allocator<std::pair<int_const,std::__cxx11::string>>>
  ::insert<std::pair<int,std::__cxx11::string>>
            ((map<int,std::__cxx11::string,std::less<int>,std::allocator<std::pair<int_const,std::__cxx11::string>>>
              *)&this->encodingLabel,&local_48);
  std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~pair(&local_48);
  return;
}

Assistant:

void PartialUnion::appendToEncodingLabel(int encoding, string label)
	{
		encodingLabel.insert(std::make_pair(encoding, label));
	}